

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-attack.c
# Opt level: O1

_Bool effect_handler_CHAIN(effect_handler_context_t *context)

{
  loc_conflict *plVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  loc grid;
  int iVar4;
  _Bool _Var5;
  wchar_t dam;
  uint32_t uVar6;
  int iVar7;
  wchar_t wVar8;
  wchar_t wVar9;
  monster *pmVar10;
  long lVar11;
  loc grid_00;
  loc grid1;
  wchar_t wVar12;
  bool bVar13;
  source sVar14;
  anon_enum_32 local_398;
  uint32_t local_394;
  anon_union_8_5_62f3dbed_for_which local_390;
  monster *avail_mon [100];
  
  dam = effect_calculate_value((effect_handler_context_t_conflict *)context,false);
  uVar6 = Rand_div(10);
  wVar2 = (player->grid).x;
  wVar3 = (player->grid).y;
  sVar14 = source_player();
  local_390 = sVar14.which;
  local_398 = sVar14.what;
  memset(avail_mon,0,800);
  if (-3 < (int)uVar6) {
    iVar7 = uVar6 + 2;
    if (iVar7 < 1) {
      iVar7 = 0;
    }
    iVar4 = 0;
    do {
      grid1.y = wVar3;
      grid1.x = wVar2;
      local_394 = 0;
      wVar12 = wVar2 + L'\xfffffffa';
      wVar8 = wVar3 + L'\xfffffffb';
      do {
        wVar12 = wVar12 + L'\x01';
        grid_00.y = wVar8;
        grid_00.x = wVar12;
        wVar9 = distance((loc_conflict)grid1,(loc_conflict)grid_00);
        if ((((wVar9 < L'\x06') && (_Var5 = square_in_bounds_fully(cave,grid_00), _Var5)) &&
            (_Var5 = projectable((chunk *)cave,grid1,grid_00,L'H'), _Var5)) &&
           (pmVar10 = square_monster(cave,grid_00), pmVar10 != (monster *)0x0)) {
          pmVar10 = square_monster(cave,grid_00);
          lVar11 = (long)(int)local_394;
          local_394 = local_394 + 1;
          avail_mon[lVar11] = pmVar10;
        }
      } while ((wVar12 < wVar2 + L'\x05') ||
              (bVar13 = wVar8 < wVar3 + L'\x05', wVar12 = wVar2 + L'\xfffffffa',
              wVar8 = wVar8 + L'\x01', bVar13));
      if (local_394 == 0) {
        return true;
      }
      uVar6 = Rand_div(local_394);
      plVar1 = &avail_mon[(int)uVar6]->grid;
      wVar2 = plVar1->x;
      wVar3 = (avail_mon[(int)uVar6]->grid).y;
      grid.x = plVar1->x;
      grid.y = plVar1->y;
      pmVar10 = square_monster(cave,grid);
      if (pmVar10 == (monster *)0x0) {
        return true;
      }
      sVar14._4_4_ = 0;
      sVar14.what = local_398;
      sVar14.which.trap = local_390.trap;
      project(sVar14,L'\x01',grid,dam,context->subtype,L'H',L'\0','\0',(object *)0x0);
      pmVar10 = square_monster(cave,grid);
      if (pmVar10 == avail_mon[(int)uVar6]) {
        sVar14 = source_monster(avail_mon[(int)uVar6]->midx);
      }
      else {
        sVar14 = source_grid(grid);
      }
      local_390 = sVar14.which;
      local_398 = sVar14.what;
      bVar13 = iVar4 != iVar7;
      iVar4 = iVar4 + 1;
    } while (bVar13);
  }
  return true;
}

Assistant:

bool effect_handler_CHAIN(effect_handler_context_t *context)
{
	int dam = effect_calculate_value(context, false);
	int k, strikes = 2 + randint1(10);
	struct loc grid, target, cur = player->grid;
	int pick, avail_mon_num;
	int flag = PROJECT_STOP | PROJECT_KILL;
	struct monster *avail_mon[100];
	struct source src = source_player();

	/* Initialise */
	for (k = 0; k < 100; k++) {
		avail_mon[k] = NULL;
	}
	target = cur;

	/* Start striking */
	for (k = 0; k < strikes; k++) {
		/* No targets yet */
		avail_mon_num = 0;

		/* Find something in range */
		for (grid.y = cur.y - 5; grid.y <= cur.y + 5; grid.y++) {
			for (grid.x = cur.x - 5; grid.x <= cur.x + 5; grid.x++) {
				int dist = distance(cur, grid);

				/* Skip distant grids */
				if (dist > 5) continue;

				/* Skip grids that are out of bounds */
				if (!square_in_bounds_fully(cave, grid)) continue;

				/* Skip grids that are not projectable */
				if (!projectable(cave, cur, grid, flag)) continue;

				/* Skip grids with no monster (including player) */
				if (!square_monster(cave, grid)) continue;

				/* Record the monster */
				avail_mon[avail_mon_num++] = square_monster(cave, grid);
			}
		}

		/* Maybe we're at a dead end */
		if (!avail_mon_num)	return true;

		/* Pick a target... */
		pick = randint0(avail_mon_num);
		target = avail_mon[pick]->grid;

		/* Paranoia */
		if (!square_monster(cave, target)) return true;

		/* ...and hit it */
		project(src, 1, target, dam, context->subtype, flag, 0, 0, NULL);

		/* Set next source (current monster may be dead) */
		cur = target;
		if (square_monster(cave, cur) == avail_mon[pick]) {
			src = source_monster(avail_mon[pick]->midx);
		} else {
			src = source_grid(cur);
		}
	}

	return true;
}